

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

bool __thiscall choc::value::Type::Object::usesStrings(Object *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  MemberNameAndType *m;
  MemberNameAndType *pMVar4;
  
  pMVar4 = (this->members).items;
  lVar1 = (ulong)(this->members).size * 0x30;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0) break;
    bVar2 = Type::usesStrings(&pMVar4->type);
    pMVar4 = pMVar4 + 1;
    lVar1 = lVar3 + -0x30;
  } while (!bVar2);
  return lVar3 != 0;
}

Assistant:

ObjectType* end() const                     { return items + size; }